

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

FT_F26Dot6 Round_To_Half_Grid(TT_ExecContext exc,FT_F26Dot6 distance,FT_Int color)

{
  long lVar1;
  long local_30;
  FT_F26Dot6 val;
  FT_F26Dot6 compensation;
  FT_Int color_local;
  FT_F26Dot6 distance_local;
  TT_ExecContext exc_local;
  
  lVar1 = (exc->tt_metrics).compensations[color];
  if (distance < 0) {
    lVar1 = (lVar1 - distance & 0xffffffffffffffc0U) + 0x20;
    local_30 = -lVar1;
    if (lVar1 < 0) {
      local_30 = -0x20;
    }
  }
  else {
    local_30 = (distance + lVar1 & 0xffffffffffffffc0U) + 0x20;
    if (local_30 < 0) {
      local_30 = 0x20;
    }
  }
  return local_30;
}

Assistant:

static FT_F26Dot6
  Round_To_Half_Grid( TT_ExecContext  exc,
                      FT_F26Dot6      distance,
                      FT_Int          color )
  {
    FT_F26Dot6  compensation = exc->tt_metrics.compensations[color];
    FT_F26Dot6  val;


    if ( distance >= 0 )
    {
      val = ADD_LONG( FT_PIX_FLOOR( ADD_LONG( distance, compensation ) ),
                      32 );
      if ( val < 0 )
        val = 32;
    }
    else
    {
      val = NEG_LONG( ADD_LONG( FT_PIX_FLOOR( SUB_LONG( compensation,
                                                        distance ) ),
                                32 ) );
      if ( val > 0 )
        val = -32;
    }

    return val;
  }